

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
t_js_generator::js_namespace_pieces_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,t_js_generator *this,t_program *p)

{
  long lVar1;
  string local_c8 [32];
  value_type local_a8;
  undefined4 local_88;
  undefined1 local_81;
  long local_80;
  size_type loc;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string ns;
  t_program *p_local;
  t_js_generator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pieces;
  
  ns.field_2._8_8_ = p;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"js",&local_61);
  t_program::get_namespace((string *)local_40,p,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_81 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  if ((this->no_ns_ & 1U) == 0) {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      while (local_80 = std::__cxx11::string::find(local_40,0x4e5538), local_80 != -1) {
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)local_40);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::substr((ulong)local_c8,(ulong)local_40);
        std::__cxx11::string::operator=((string *)local_40,local_c8);
        std::__cxx11::string::~string(local_c8);
      }
      local_80 = -1;
    }
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
    }
  }
  local_81 = 1;
  local_88 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> js_namespace_pieces(t_program* p) {
    std::string ns = p->get_namespace("js");

    std::string::size_type loc;
    std::vector<std::string> pieces;

    if (no_ns_) {
      return pieces;
    }

    if (ns.size() > 0) {
      while ((loc = ns.find(".")) != std::string::npos) {
        pieces.push_back(ns.substr(0, loc));
        ns = ns.substr(loc + 1);
      }
    }

    if (ns.size() > 0) {
      pieces.push_back(ns);
    }

    return pieces;
  }